

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyFileCreatorByTypeTests.cpp
# Opt level: O3

void anon_unknown.dwarf_35b544::assertNewFileContents
               (string *extensionWithDot,string *expectedContents)

{
  pointer pcVar1;
  code *pcVar2;
  double dVar3;
  char extraout_AL;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string received;
  ResultBuilder DOCTEST_RB;
  ExpressionDecomposer local_17c;
  char *local_178;
  undefined8 local_170;
  char local_168;
  undefined7 uStack_167;
  undefined8 uStack_160;
  anon_union_24_2_13149d16_for_String_3 local_158;
  undefined8 uStack_140;
  Enum local_138;
  long *local_130 [2];
  long local_120 [2];
  string local_110;
  string local_f0;
  Result local_d0;
  undefined1 local_b0 [48];
  String local_80;
  String local_68;
  String local_40;
  
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>
  ::getDefaultNamer();
  pcVar1 = (extensionWithDot->_M_dataplus)._M_p;
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_130,pcVar1,pcVar1 + extensionWithDot->_M_string_length);
  (**(code **)((((String *)local_b0._0_8_)->field_0).data.ptr + 0x18))
            (&local_110,local_b0._0_8_,local_130);
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
  }
  remove(local_110._M_dataplus._M_p);
  ApprovalTests::FileUtils::ensureFileExists(&local_110);
  doctest::String::String((String *)&local_158.data,"");
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_b0,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/DocTest_Tests/utilities/EmptyFileCreatorByTypeTests.cpp"
             ,0x12,"expectedContents + \"\\n\" == FileUtils::readFileThrowIfMissing(received)","",
             (String *)&local_158.data);
  doctest::String::~String((String *)&local_158.data);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_17c,DT_CHECK);
  pcVar1 = (expectedContents->_M_dataplus)._M_p;
  local_178 = &local_168;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,pcVar1,pcVar1 + expectedContents->_M_string_length);
  std::__cxx11::string::append((char *)&local_178);
  if (local_178 == &local_168) {
    uStack_140 = uStack_160;
    local_158.data.ptr = local_158.buf + 0x10;
  }
  else {
    local_158.data.ptr = local_178;
  }
  local_158._17_7_ = uStack_167;
  local_158.buf[0x10] = local_168;
  local_158._8_8_ = local_170;
  local_170 = 0;
  local_168 = '\0';
  local_138 = local_17c.m_at;
  local_178 = &local_168;
  ApprovalTests::FileUtils::readFileThrowIfMissing(&local_f0,&local_110);
  doctest::detail::Expression_lhs<std::__cxx11::string>::operator==
            (&local_d0,(Expression_lhs<std::__cxx11::string> *)&local_158.data,&local_f0);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_b0,&local_d0);
  doctest::String::~String(&local_d0.m_decomp);
  uVar4 = extraout_XMM0_Da;
  uVar5 = extraout_XMM0_Db;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    uVar4 = extraout_XMM0_Da_00;
    uVar5 = extraout_XMM0_Db_00;
  }
  if (local_158.data.ptr != local_158.buf + 0x10) {
    operator_delete(local_158.data.ptr,local_158._16_8_ + 1);
    uVar4 = extraout_XMM0_Da_01;
    uVar5 = extraout_XMM0_Db_01;
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
    uVar4 = extraout_XMM0_Da_02;
    uVar5 = extraout_XMM0_Db_02;
  }
  dVar3 = doctest::detail::ResultBuilder::log
                    ((ResultBuilder *)local_b0,(double)CONCAT44(uVar5,uVar4));
  if (extraout_AL != '\0') {
    pcVar2 = (code *)swi(3);
    (*pcVar2)(SUB84(dVar3,0));
    return;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)local_b0);
  doctest::String::~String(&local_40);
  doctest::String::~String(&local_68);
  doctest::String::~String(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void assertNewFileContents(const std::string& extensionWithDot,
                               const std::string& expectedContents)
    {
        auto received = Approvals::getDefaultNamer()->getReceivedFile(extensionWithDot);
        remove(received.c_str());

        FileUtils::ensureFileExists(received);
        CHECK(expectedContents + "\n" == FileUtils::readFileThrowIfMissing(received));
    }